

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

void luaG_runerror(lua_State *L,char *fmt,...)

{
  CallInfo *pCVar1;
  Proto *f;
  TString *src;
  long lVar2;
  char in_AL;
  int line;
  char *msg;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  __va_list_tag local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  pCVar1 = L->ci;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (L->l_G->GCdebt < 1) {
    luaC_step(L);
  }
  local_e8.reg_save_area = local_c8;
  local_e8.overflow_arg_area = &argp[0].overflow_arg_area;
  local_e8.gp_offset = 0x10;
  local_e8.fp_offset = 0x30;
  msg = luaO_pushvfstring(L,fmt,&local_e8);
  if (msg == (char *)0x0) {
    luaD_throw(L,'\x04');
  }
  if ((pCVar1->callstatus & 0x8000) == 0) {
    f = *(Proto **)((((pCVar1->func).p)->val).value_.f + 0x18);
    src = f->source;
    line = luaG_getfuncline(f,(int)((ulong)((long)(pCVar1->u).l.savedpc - (long)f->code) >> 2) + -1)
    ;
    luaG_addinfo(L,msg,src,line);
    lVar2 = (L->top).offset;
    *(undefined8 *)(lVar2 + -0x20) = *(undefined8 *)(lVar2 + -0x10);
    *(undefined1 *)(lVar2 + -0x18) = *(undefined1 *)(lVar2 + -8);
    (L->top).p = (StkId)((L->top).offset + -0x10);
  }
  luaG_errormsg(L);
}

Assistant:

l_noret luaG_runerror (lua_State *L, const char *fmt, ...) {
  CallInfo *ci = L->ci;
  const char *msg;
  va_list argp;
  luaC_checkGC(L);  /* error message uses memory */
  va_start(argp, fmt);
  msg = luaO_pushvfstring(L, fmt, argp);  /* format message */
  va_end(argp);
  if (msg == NULL)  /* no memory to format message? */
    luaD_throw(L, LUA_ERRMEM);
  else if (isLua(ci)) {  /* Lua function? */
    /* add source:line information */
    luaG_addinfo(L, msg, ci_func(ci)->p->source, getcurrentline(ci));
    setobjs2s(L, L->top.p - 2, L->top.p - 1);  /* remove 'msg' */
    L->top.p--;
  }
  luaG_errormsg(L);
}